

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOneofHasBits
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  string *psVar2;
  int __c;
  char *pcVar3;
  Iterator IVar4;
  string local_130;
  allocator local_109;
  string local_108;
  int local_e8;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  value_type local_98;
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl local_60;
  OneOfRangeImpl *local_58;
  OneOfRangeImpl *__range3;
  Formatter format;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)&__range3,printer,&this->variables_);
  local_60 = OneOfRange(this->descriptor_);
  local_58 = &local_60;
  IVar4 = OneOfRangeImpl::begin(local_58);
  __end3.descriptor._0_4_ = IVar4.idx;
  IVar4 = OneOfRangeImpl::end(local_58);
  __end3._0_8_ = IVar4.descriptor;
  oneof._0_4_ = IVar4.idx;
  while( true ) {
    bVar1 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof);
    if (!bVar1) break;
    local_98 = OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b8,"oneof_name",&local_b9);
    psVar2 = OneofDescriptor::name_abi_cxx11_(local_98);
    Formatter::Set<std::__cxx11::string>((Formatter *)&__range3,&local_b8,psVar2);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::allocator<char>::allocator();
    pcVar3 = "oneof_index";
    std::__cxx11::string::string((string *)&local_e0,"oneof_index",&local_e1);
    pcVar3 = OneofDescriptor::index(local_98,pcVar3,__c);
    local_e8 = (int)pcVar3;
    Formatter::Set<int>((Formatter *)&__range3,&local_e0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"cap_oneof_name",&local_109);
    psVar2 = OneofDescriptor::name_abi_cxx11_(local_98);
    ToUpper(&local_130,psVar2);
    Formatter::Set<std::__cxx11::string>((Formatter *)&__range3,&local_108,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    Formatter::operator()<>
              ((Formatter *)&__range3,
               "inline bool $classname$::has_$oneof_name$() const {\n  return $oneof_name$_case() != $cap_oneof_name$_NOT_SET;\n}\ninline void $classname$::clear_has_$oneof_name$() {\n  _oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n}\n"
              );
    OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
  }
  Formatter::~Formatter((Formatter *)&__range3);
  return;
}

Assistant:

void MessageGenerator::GenerateOneofHasBits(io::Printer* printer) {
  Formatter format(printer, variables_);
  for (auto oneof : OneOfRange(descriptor_)) {
    format.Set("oneof_name", oneof->name());
    format.Set("oneof_index", oneof->index());
    format.Set("cap_oneof_name", ToUpper(oneof->name()));
    format(
        "inline bool $classname$::has_$oneof_name$() const {\n"
        "  return $oneof_name$_case() != $cap_oneof_name$_NOT_SET;\n"
        "}\n"
        "inline void $classname$::clear_has_$oneof_name$() {\n"
        "  _oneof_case_[$oneof_index$] = $cap_oneof_name$_NOT_SET;\n"
        "}\n");
  }
}